

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

string * __thiscall
tinyformat::format<double,int,int,double,double>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,double *args,int *args_1,
          int *args_2,double *args_3,double *args_4)

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream local_1b0 [112];
  ios_base local_140 [264];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  format<double,int,int,double,double>
            ((ostream *)local_1b0,(char *)this,(double *)fmt,(int *)args,args_1,(double *)args_2,
             args_3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  std::ios_base::~ios_base(local_140);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}